

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

uint128_wrapper * fmt::v7::detail::dragonbox::umul128(uint64_t x,uint64_t y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong in_RSI;
  ulong in_RDI;
  uint128_wrapper *local_18 [3];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RDI;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RSI;
  uint128_wrapper::uint128_wrapper((uint128_wrapper *)local_18,(uint128_t)(auVar1 * auVar2));
  return local_18[0];
}

Assistant:

FMT_SAFEBUFFERS inline uint128_wrapper umul128(uint64_t x,
                                               uint64_t y) FMT_NOEXCEPT {
#if FMT_USE_INT128
  return static_cast<uint128_t>(x) * static_cast<uint128_t>(y);
#elif defined(_MSC_VER) && defined(_M_X64)
  uint128_wrapper result;
  result.low_ = _umul128(x, y, &result.high_);
  return result;
#else
  const uint64_t mask = (uint64_t(1) << 32) - uint64_t(1);

  uint64_t a = x >> 32;
  uint64_t b = x & mask;
  uint64_t c = y >> 32;
  uint64_t d = y & mask;

  uint64_t ac = a * c;
  uint64_t bc = b * c;
  uint64_t ad = a * d;
  uint64_t bd = b * d;

  uint64_t intermediate = (bd >> 32) + (ad & mask) + (bc & mask);

  return {ac + (intermediate >> 32) + (ad >> 32) + (bc >> 32),
          (intermediate << 32) + (bd & mask)};
#endif
}